

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsntopologybasedenergy.cpp
# Opt level: O1

void __thiscall WSNTopologyBasedEnergy::SelectLeaderID(WSNTopologyBasedEnergy *this)

{
  WSNNode *this_00;
  WSNNode *pWVar1;
  Scalar *pSVar2;
  double *pdVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  WSNTopologyBasedEnergy *this_01;
  WSNNode *pWVar7;
  ulong uVar8;
  bool bVar9;
  long *local_c8 [2];
  long local_b8 [2];
  WSNNode *local_a8;
  _InputArray local_a0;
  WSNNode local_88;
  
  local_a8 = this->LayerLeaderNode;
  iVar6 = 0;
  do {
    pWVar7 = this->LayerLeaderSeq[iVar6].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>.
             _M_impl.super__Vector_impl_data._M_start;
    bVar9 = pWVar7 == this->LayerLeaderSeq[iVar6].
                      super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
                      super__Vector_impl_data._M_finish;
    if (bVar9) {
      uVar8 = 0;
    }
    else {
      iVar5 = WSNNode::GetNodeID(pWVar7);
      uVar8 = 0;
      if (this->node[iVar5].energy < this->ThresEnergy[iVar6]) {
        uVar8 = 0;
        do {
          uVar8 = (ulong)((int)uVar8 + 1);
          pWVar7 = pWVar7 + 1;
          bVar9 = pWVar7 == this->LayerLeaderSeq[iVar6].
                            super__Vector_base<WSNNode,_std::allocator<WSNNode>_>._M_impl.
                            super__Vector_impl_data._M_finish;
          if (bVar9) goto LAB_0010606a;
          iVar5 = WSNNode::GetNodeID(pWVar7);
        } while (this->node[iVar5].energy < this->ThresEnergy[iVar6]);
      }
      this_00 = local_a8 + iVar6;
      iVar5 = pWVar7->id;
      local_a8[iVar6].leaderID = pWVar7->leaderID;
      local_a8[iVar6].id = iVar5;
      iVar5 = pWVar7->y;
      dVar4 = pWVar7->energy;
      pWVar1 = local_a8 + iVar6;
      pWVar1->x = pWVar7->x;
      pWVar1->y = iVar5;
      pWVar1->energy = dVar4;
      local_a8[iVar6].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
           (pWVar7->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
      local_a8[iVar6].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
           (pWVar7->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1];
      local_a8[iVar6].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
           (pWVar7->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2];
      local_a8[iVar6].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
           (pWVar7->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3];
      iVar5 = WSNNode::GetNodeID(this_00);
      local_88.leaderID = this->node[iVar5].leaderID;
      local_88.id = this->node[iVar5].id;
      pWVar7 = this->node + iVar5;
      local_88.x = pWVar7->x;
      local_88.y = pWVar7->y;
      local_88.energy = pWVar7->energy;
      pSVar2 = &this->node[iVar5].color;
      local_88.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
           (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
      local_88.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
           (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
      pdVar3 = this->node[iVar5].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
      local_88.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
      local_88.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
      iVar5 = WSNNode::GetNodeID(this_00);
      this_01 = (WSNTopologyBasedEnergy *)&stack0xffffffffffffffb0;
      WSNNode::NodeColor((Scalar *)this_01,this->node + iVar5);
      drawCrossNode(this_01,&this->img,&local_88,(Scalar *)&stack0xffffffffffffffb0);
      WSNNode::~WSNNode(&local_88);
      local_c8[0] = local_b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"WSN","");
      local_a0.sz.width = 0;
      local_a0.sz.height = 0;
      local_a0.flags = 0x1010000;
      local_a0.obj = this;
      cv::imshow((string *)local_c8,&local_a0);
      if (local_c8[0] != local_b8) {
        operator_delete(local_c8[0],local_b8[0] + 1);
      }
      iVar6 = iVar6 + 1;
    }
LAB_0010606a:
    if ((bVar9) &&
       (((long)this->LayerLeaderSeq[iVar6].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)this->LayerLeaderSeq[iVar6].super__Vector_base<WSNNode,_std::allocator<WSNNode>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7 - uVar8 == 0)) {
      this->ThresEnergy[iVar6] = this->ThresEnergy[iVar6] * 3.0 * 0.25;
      this->Mark[iVar6] = this->Mark[iVar6] + 1;
    }
    if (4 < iVar6) {
      return;
    }
  } while( true );
}

Assistant:

void WSNTopologyBasedEnergy::SelectLeaderID()
{
	vector<WSNNode>::iterator it;
	int i=0;
	while(i<LayerNum)
	{
		int j=0;
		bool   BREAK=false;
		for(it=LayerLeaderSeq[i].begin();it!=LayerLeaderSeq[i].end();it++)
		{
			if(node[it->GetNodeID()].energy>=ThresEnergy[i])
			{
				LayerLeaderNode[i]=*it;
				drawCrossNode(img,node[LayerLeaderNode[i].GetNodeID()],node[LayerLeaderNode[i].GetNodeID()].NodeColor());
				imshow("WSN",img);
				i++;
				BREAK=true;
				break;
			}
			j++;
		}
		if(BREAK) continue;
		if(j==LayerLeaderSeq[i].size())
		{
			ThresEnergy[i]=3*ThresEnergy[i]/4;
			Mark[i]++;
		}

	}
}